

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O0

QSize __thiscall QProgressBar::minimumSizeHint(QProgressBar *this)

{
  Orientation OVar1;
  long *in_RDI;
  long in_FS_OFFSET;
  QSize size;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QSize *in_stack_ffffffffffffffa0;
  QFontMetrics local_38 [8];
  QSize local_30;
  QFontMetrics local_28 [8];
  undefined8 local_20;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize(in_stack_ffffffffffffffa0);
  OVar1 = orientation((QProgressBar *)in_stack_ffffffffffffffa0);
  if (OVar1 == Horizontal) {
    local_20 = (**(code **)(*in_RDI + 0x70))();
    QSize::width((QSize *)0x6630c4);
    QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QFontMetrics::height();
    QSize::QSize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    local_10 = local_18;
    QFontMetrics::~QFontMetrics(local_28);
  }
  else {
    QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QFontMetrics::height();
    (**(code **)(*in_RDI + 0x70))();
    QSize::height((QSize *)0x663144);
    QSize::QSize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    local_10 = local_30;
    QFontMetrics::~QFontMetrics(local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QProgressBar::minimumSizeHint() const
{
    QSize size;
    if (orientation() == Qt::Horizontal)
        size = QSize(sizeHint().width(), fontMetrics().height() + 2);
    else
        size = QSize(fontMetrics().height() + 2, sizeHint().height());
    return size;
}